

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

int __thiscall
MODEL3D::three_dim_model::generate_model
          (three_dim_model *this,string *gds_path,string *pif_path,string *py_path,string *cont_path
          ,bool *multi_flag)

{
  int iVar1;
  ostream *poVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  int iVar5;
  _Self __tmp;
  _Rb_tree_color local_224;
  string *local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_string_vector;
  is_any_ofF<char> local_1f0;
  string local_1d8;
  string local_1b8;
  section_data section_polygon_only;
  gdscpp gds_file;
  
  local_220 = py_path;
  gdscpp::gdscpp(&gds_file);
  section_polygon_only.polygons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &section_polygon_only.polygons._M_t._M_impl.super__Rb_tree_header._M_header;
  section_polygon_only.polygons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  section_polygon_only.polygons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  section_polygon_only.polygons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  section_polygon_only.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &section_polygon_only.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header;
  section_polygon_only.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  section_polygon_only.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  section_polygon_only.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  section_polygon_only.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &section_polygon_only.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header;
  section_polygon_only.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  section_polygon_only.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  section_polygon_only.section_blocks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  section_polygon_only.x1 = 0;
  section_polygon_only.y1 = 0;
  section_polygon_only.x2 = 0;
  section_polygon_only.y2 = 0;
  section_polygon_only.axis_type = 0;
  section_polygon_only.xsec_distance = 0;
  this->enable_multiprocessing = *multi_flag;
  split_string_vector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  split_string_vector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  split_string_vector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  section_polygon_only.polygons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       section_polygon_only.polygons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  section_polygon_only.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       section_polygon_only.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  section_polygon_only.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       section_polygon_only.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::algorithm::is_any_of<char[4]>(&local_1f0,(char (*) [4])"./\\");
  iVar5 = 1;
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            (&split_string_vector,local_220,&local_1f0,token_compress_off);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_1f0);
  std::__cxx11::string::_M_assign((string *)&this->cell_name);
  std::__cxx11::string::string((string *)&local_1b8,(string *)gds_path);
  iVar1 = gdscpp::import(&gds_file,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (iVar1 == 0) {
    import_process_info(this,pif_path);
    iVar1 = load_etch_contour_map(this,cont_path);
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Beginning GDS expansion process...");
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar1 = section_data::extract_all_polygons
                        (&section_polygon_only,&gds_file,&this->polygons_map);
      if (iVar1 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"GDS expansion completed.");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      calculate_all_layer_bounds(this);
      poVar2 = std::operator<<((ostream *)&std::cout,"Converting polygons to clipper format...");
      std::endl<char,std::char_traits<char>>(poVar2);
      synchronize_clipper_polygons_map(this);
      poVar2 = std::operator<<((ostream *)&std::cout,"Polygon map ready.");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "# ------------------------- Generating 3D Layers ------------------------- #"
                              );
      std::endl<char,std::char_traits<char>>(poVar2);
      initialize_python_script(this);
      p_Var4 = (this->polygons_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar1 = 1;
      while ((_Rb_tree_header *)p_Var4 != &(this->polygons_map)._M_t._M_impl.super__Rb_tree_header)
      {
        poVar2 = std::operator<<((ostream *)&std::cout,"Generating Layer ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
        poVar2 = std::operator<<(poVar2,"/");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2,"\t---> ");
        local_224 = p_Var4[1]._M_color;
        iVar3 = std::
                _Rb_tree<int,_std::pair<const_int,_MODEL3D::Layer_prop>,_std::_Select1st<std::pair<const_int,_MODEL3D::Layer_prop>_>,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
                ::find(&(this->proc_info_map)._M_t,(key_type *)&local_224);
        if ((_Rb_tree_header *)iVar3._M_node !=
            &(this->proc_info_map)._M_t._M_impl.super__Rb_tree_header) {
          local_224 = p_Var4[1]._M_color;
          generate_layer(this,(int *)&local_224);
        }
        poVar2 = std::operator<<((ostream *)&std::cout,"Done.");
        std::endl<char,std::char_traits<char>>(poVar2);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        iVar1 = iVar1 + 1;
      }
      python_script_conclude(this);
      std::__cxx11::string::string((string *)&local_1d8,(string *)local_220);
      python_script_write(this,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "# ----------------------- Model Generation Complete ---------------------- #"
                              );
      iVar5 = 0;
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&split_string_vector);
  section_data::~section_data(&section_polygon_only);
  gdscpp::~gdscpp(&gds_file);
  return iVar5;
}

Assistant:

int MODEL3D::three_dim_model::generate_model(
const std::string &gds_path,
const std::string &pif_path,
const std::string &py_path,
const std::string &cont_path,
const bool        &multi_flag)
{
    gdscpp gds_file;
    section_data section_polygon_only;
    enable_multiprocessing = multi_flag;
    std::vector<std::string> split_string_vector;
    boost::split(split_string_vector, py_path, boost::is_any_of("./\\"));
    cell_name = *std::prev(split_string_vector.end(),2);;
    if(gds_file.import(gds_path)==EXIT_SUCCESS)
    {
        import_process_info(pif_path);
        if(load_etch_contour_map(cont_path)==EXIT_SUCCESS)
        {
            // Populate polygon map with all GDS data
            std::cout<<"Beginning GDS expansion process..."<<std::endl;
            if(section_polygon_only.extract_all_polygons(gds_file, polygons_map)==EXIT_SUCCESS)
                std::cout<<"GDS expansion completed."<<std::endl;
            calculate_all_layer_bounds();
            // Convert map to clipper library compatible form
            std::cout<<"Converting polygons to clipper format..."<<std::endl;
            synchronize_clipper_polygons_map();
            std::cout<<"Polygon map ready."<<std::endl;
            // Generate a volume for each layer
            std::cout<< "# ------------------------- Generating 3D Layers ------------------------- #"<<std::endl;
            auto layer_end = polygons_map.end();
            int layer_count = 0;
            size_t total_layers = polygons_map.size();
            // if all layer contours are loaded
            // else state that a layer contour is missing
            // int p_cnt = 0;
            // int ln_cnt = 0;
            // int cl_cnt = 0;
            // int ps_cnt = 0;
            // int sl_cnt = 0;
            // int vl_cnt = 0;
            initialize_python_script();
            for (auto layer = polygons_map.begin(); layer != layer_end; layer++)
            {
                std::cout << "Generating Layer "
                << ++layer_count << "/" << total_layers
                << "\t---> ";
                if(proc_info_map.find(layer->first)!=proc_info_map.end())
                    generate_layer(layer->first);
                std::cout << "Done." << std::endl;
            }
            // generate_layer(60);
            python_script_conclude();
            python_script_write(py_path);
            std::cout<< "# ----------------------- Model Generation Complete ---------------------- #"<<std::endl;
            return EXIT_SUCCESS;
        }
        else
            return EXIT_FAILURE;
    }
    else
        return EXIT_FAILURE;
}